

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall Units_parentOfUnits_Test::~Units_parentOfUnits_Test(Units_parentOfUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, parentOfUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("I_am_a_model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    model->addUnits(u);

    libcellml::ModelPtr parent = std::dynamic_pointer_cast<libcellml::Model>(u->parent());
    EXPECT_FALSE(parent == nullptr);
    EXPECT_EQ(model, parent);
}